

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O3

bool __thiscall
libwebm::VpxPesParser::ParseNextPacket(VpxPesParser *this,PesHeader *header,VideoFrame *frame)

{
  ulong bytes_required;
  long lVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  int64_t iVar5;
  ulong uVar6;
  size_t consumed;
  size_t packet_start_pos;
  size_t local_38;
  size_t local_30;
  
  if ((((frame != (VideoFrame *)0x0 && header != (PesHeader *)0x0) && (*(int *)(this + 0x78) == 0))
      && (local_30 = *(size_t *)(this + 0x70),
         *(int *)(this + 0x60) != *(int *)(this + 0x58) + (int)local_30)) &&
     (bVar3 = FindStartCode(this,local_30,&local_30), sVar2 = local_30, bVar3)) {
    *(undefined4 *)(this + 0x78) = 1;
    *(size_t *)(this + 0x70) = local_30;
    bVar3 = ParsePesHeader(this,header);
    if (((bVar3) && (bVar3 = ParsePesOptionalHeader(this,&header->opt_header), bVar3)) &&
       (bVar3 = ParseBcmvHeader(this,&header->bcmv_header), bVar3)) {
      uVar6 = (ulong)(header->bcmv_header).length;
      bytes_required = uVar6 - 10;
      lVar1 = *(long *)(this + 0x70);
      uVar4 = *(long *)(this + 0x60) - *(long *)(this + 0x58);
      if (uVar4 < (uVar6 + lVar1) - 10) {
        printf("VpxPesParser: Not enough data. Required: %u Available: %u\n",
               bytes_required & 0xffffffff,(ulong)(uint)((int)uVar4 - (int)lVar1));
        *(undefined4 *)(this + 0x78) = 0;
        *(size_t *)(this + 0x70) = sVar2;
        return false;
      }
      uVar4 = (ulong)header->packet_length;
      if ((uVar4 == 0) || (uVar4 - *(long *)(this + 0x18) == uVar6)) {
        local_38 = 0;
        bVar3 = RemoveStartCodeEmulationPreventionBytes
                          (this,(uint8_t *)(*(long *)(this + 0x58) + lVar1),bytes_required,
                           (PacketData *)(this + 0x40),&local_38);
        if (!bVar3) {
          return false;
        }
        *(size_t *)(this + 0x70) = *(long *)(this + 0x70) + local_38;
      }
      else {
        bVar3 = AccumulateFragmentedPayload(this,uVar4,bytes_required);
        if (!bVar3) {
          ParseNextPacket();
          return false;
        }
      }
      if (((ulong)(*(long *)(this + 0x48) - *(long *)(this + 0x40)) <= (frame->buffer_).capacity) ||
         (bVar3 = VideoFrame::Init(frame,*(long *)(this + 0x48) - *(long *)(this + 0x40)), bVar3)) {
        iVar5 = Khz90TicksToNanoseconds((header->opt_header).pts);
        frame->nanosecond_pts_ = iVar5;
        memcpy((uchar *)(frame->buffer_).data._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>,*(void **)(this + 0x40),
               *(long *)(this + 0x48) - (long)*(void **)(this + 0x40));
        VideoFrame::SetBufferLength(frame,*(long *)(this + 0x48) - *(long *)(this + 0x40));
        if (*(long *)(this + 0x48) != *(long *)(this + 0x40)) {
          *(long *)(this + 0x48) = *(long *)(this + 0x40);
        }
        *(undefined4 *)(this + 0x78) = 0;
        return true;
      }
      ParseNextPacket();
    }
  }
  return false;
}

Assistant:

bool VpxPesParser::ParseNextPacket(PesHeader* header, VideoFrame* frame) {
  if (!header || !frame || parse_state_ != kFindStartCode ||
      BytesAvailable() == 0) {
    return false;
  }

  std::size_t packet_start_pos = read_pos_;
  if (!FindStartCode(read_pos_, &packet_start_pos)) {
    return false;
  }
  parse_state_ = kParsePesHeader;
  read_pos_ = packet_start_pos;

  if (!ParsePesHeader(header)) {
    return false;
  }
  if (!ParsePesOptionalHeader(&header->opt_header)) {
    return false;
  }
  if (!ParseBcmvHeader(&header->bcmv_header)) {
    return false;
  }

  // BCMV header length includes the length of the BCMVHeader itself. Adjust:
  const std::size_t payload_length =
      header->bcmv_header.length - BcmvHeader::size();

  // Make sure there's enough input data to read the entire frame.
  if (read_pos_ + payload_length > pes_file_data_.size()) {
    // Need more data.
    printf("VpxPesParser: Not enough data. Required: %u Available: %u\n",
           static_cast<unsigned int>(payload_length),
           static_cast<unsigned int>(pes_file_data_.size() - read_pos_));
    parse_state_ = kFindStartCode;
    read_pos_ = packet_start_pos;
    return false;
  }

  if (IsPayloadFragmented(*header)) {
    if (!AccumulateFragmentedPayload(header->packet_length, payload_length)) {
      fprintf(stderr, "VpxPesParser: Failed parsing fragmented payload!\n");
      return false;
    }
  } else {
    std::size_t consumed = 0;
    if (!RemoveStartCodeEmulationPreventionBytes(
            &pes_file_data_[read_pos_], payload_length, &payload_, &consumed)) {
      return false;
    }
    read_pos_ += consumed;
  }

  if (frame->buffer().capacity < payload_.size()) {
    if (frame->Init(payload_.size()) == false) {
      fprintf(stderr, "VpxPesParser: Out of memory.\n");
      return false;
    }
  }
  frame->set_nanosecond_pts(Khz90TicksToNanoseconds(header->opt_header.pts));
  std::memcpy(frame->buffer().data.get(), &payload_[0], payload_.size());
  frame->SetBufferLength(payload_.size());

  payload_.clear();
  parse_state_ = kFindStartCode;

  return true;
}